

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O3

void __thiscall TPZEqnArray<float>::Reset(TPZEqnArray<float> *this)

{
  TPZManVector<int,_100>::Resize(&(this->fEqStart).super_TPZManVector<int,_100>,0);
  (*(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec[3])
            (&this->fEqStart);
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore
  [(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements + -1] = 0;
  TPZManVector<float,_1000>::Resize(&(this->fEqValues).super_TPZManVector<float,_1000>,0);
  TPZManVector<int,_1000>::Resize(&(this->fIndex).super_TPZManVector<int,_1000>,0);
  this->fLastTerm = 0;
  this->fSymmetric = EIsUndefined;
  this->fNumEq = 0;
  return;
}

Assistant:

void TPZEqnArray<TVar>::Reset(){
	fEqStart.Resize(0);
	fEqStart.Push(0);
	fEqValues.Resize(0);
	fIndex.Resize(0);
	fNumEq=0;
	fLastTerm=0;
	fSymmetric=EIsUndefined;
	
}